

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.c
# Opt level: O0

ma_result ma_data_source_set_looping(ma_data_source *pDataSource,ma_bool32 isLooping)

{
  ma_data_source_base *pDataSourceBase;
  ma_bool32 isLooping_local;
  ma_data_source *pDataSource_local;
  
  if (pDataSource == (ma_data_source *)0x0) {
    pDataSource_local._4_4_ = MA_INVALID_ARGS;
  }
  else {
    LOCK();
    *(ma_bool32 *)((long)pDataSource + 0x40) = isLooping;
    UNLOCK();
    if (*(long *)(*pDataSource + 0x28) == 0) {
      pDataSource_local._4_4_ = MA_SUCCESS;
    }
    else {
      pDataSource_local._4_4_ = (**(code **)(*pDataSource + 0x28))(pDataSource,isLooping);
    }
  }
  return pDataSource_local._4_4_;
}

Assistant:

MA_API ma_result ma_data_source_set_looping(ma_data_source* pDataSource, ma_bool32 isLooping)
{
    ma_data_source_base* pDataSourceBase = (ma_data_source_base*)pDataSource;

    if (pDataSource == NULL) {
        return MA_INVALID_ARGS;
    }

    c89atomic_exchange_32(&pDataSourceBase->isLooping, isLooping);

    /* If there's no callback for this just treat it as a successful no-op. */
    if (pDataSourceBase->vtable->onSetLooping == NULL) {
        return MA_SUCCESS;
    }

    return pDataSourceBase->vtable->onSetLooping(pDataSource, isLooping);
}